

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perceptron.cpp
# Opt level: O3

void __thiscall PyreNet::Perceptron::Perceptron(Perceptron *this,int inputSize)

{
  (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->inputSize = inputSize;
  std::vector<double,_std::allocator<double>_>::resize(&this->weights,(long)(inputSize + 1));
  return;
}

Assistant:

Perceptron::Perceptron(int inputSize) {
        this->inputSize = inputSize;
        this->weights.resize(inputSize + 1);
    }